

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int32_t define_batches(PerfProfBatch *batches)

{
  uint uVar1;
  undefined *puVar2;
  char *pcVar3;
  long lVar4;
  int32_t sidx;
  long lVar5;
  long lVar6;
  PerfProfBatch *pPVar7;
  int iVar8;
  ulong uVar9;
  char batch_name [256];
  char dirpath [2048];
  
  uVar9 = 0;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    puVar2 = (&PTR_anon_var_dwarf_ae2_00113480)[lVar4];
    lVar5 = 0;
    for (lVar6 = 0; lVar6 != 0x1c; lVar6 = lVar6 + 4) {
      if (3 < lVar5 - 3U) {
        uVar1 = *(uint *)((long)&DAT_0010c9f0 + lVar6);
        snprintf_safe(batch_name,0x100,"Fractional-labeling-comparison-for-%s-scaled-%d.0",puVar2,
                      (ulong)uVar1);
        snprintf_safe(dirpath,0x800,"data/BAP_Instances/last-10/CVRP-scaled-%d.0/%s",(ulong)uVar1,
                      puVar2);
        iVar8 = (int)uVar9;
        if (iVar8 < 0x800) {
          pPVar7 = batches + iVar8;
          pPVar7->max_num_procs = 0xe;
          pcVar3 = strdup(batch_name);
          pPVar7->name = pcVar3;
          pPVar7->timelimit = 60.0;
          pPVar7->nseeds = 1;
          pcVar3 = strdup(dirpath);
          pPVar7->dirs[0] = pcVar3;
          pPVar7->dirs[1] = (char *)0x0;
          (pPVar7->filter).family = (char *)0x0;
          (pPVar7->filter).ncustomers.a = 0;
          (pPVar7->filter).ncustomers.b = 99999;
          (pPVar7->filter).nvehicles.a = 0;
          (pPVar7->filter).nvehicles.b = 99999;
          pPVar7->solvers[0].name = "BAC MIP Pricer (EFL)";
          pPVar7->solvers[0].args[0] = "-DNUM_THREADS=1";
          memset(pPVar7->solvers[0].args + 1,0,0x7f8);
          pPVar7->solvers[1].name = "BAC MIP Pricer (AFL)";
          pPVar7->solvers[1].args[0] = "-DAMORTIZED_FRACTIONAL_LABELING=1";
          pPVar7->solvers[1].args[1] = "-DNUM_THREADS=1";
          memset(batches[iVar8].solvers[1].args + 2,0,0x7f0);
          batches[iVar8].solvers[2].name = "BAC MIP Pricer (NFL)";
          batches[iVar8].solvers[2].args[0] = "-DDISABLE_FRACTIONAL_SEPARATION=1";
          batches[iVar8].solvers[2].args[1] = "-DNUM_THREADS=1";
          memset(batches[iVar8].solvers[2].args + 2,0,0x7f0);
        }
        uVar9 = (ulong)(iVar8 + 1);
      }
      lVar5 = lVar5 + 1;
    }
  }
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    puVar2 = (&PTR_anon_var_dwarf_ae2_00113480)[lVar4];
    uVar9 = (ulong)(int)uVar9;
    pPVar7 = batches + uVar9;
    for (lVar5 = 0; lVar5 != 0x1c; lVar5 = lVar5 + 4) {
      uVar1 = *(uint *)((long)&DAT_0010c9f0 + lVar5);
      snprintf_safe(batch_name,0x100,"%s-scaled-%d.0",puVar2,(ulong)uVar1);
      snprintf_safe(dirpath,0x800,"data/BAP_Instances/last-10/CVRP-scaled-%d.0/%s",(ulong)uVar1,
                    puVar2);
      if ((long)uVar9 < 0x800) {
        pPVar7->max_num_procs = 1;
        pcVar3 = strdup(batch_name);
        pPVar7->name = pcVar3;
        pPVar7->timelimit = 10.0;
        pPVar7->nseeds = 1;
        pcVar3 = strdup(dirpath);
        pPVar7->dirs[0] = pcVar3;
        pPVar7->dirs[1] = (char *)0x0;
        (pPVar7->filter).family = (char *)0x0;
        (pPVar7->filter).ncustomers.a = 0;
        (pPVar7->filter).ncustomers.b = 99999;
        (pPVar7->filter).nvehicles.a = 0;
        (pPVar7->filter).nvehicles.b = 99999;
        pPVar7->solvers[0].name = "BAC MIP Pricer (AFL)";
        pPVar7->solvers[0].args[0] = "-DAMORTIZED_FRACTIONAL_LABELING=1";
        memset(pPVar7->solvers[0].args + 1,0,0x7f8);
        memcpy(pPVar7->solvers + 1,&BAPCOD_SOLVER,0x808);
      }
      uVar9 = uVar9 + 1;
      pPVar7 = pPVar7 + 1;
    }
  }
  return (int)uVar9;
}

Assistant:

int32_t define_batches(PerfProfBatch *batches) {
    int32_t num_batches = 0;

    const char DIRPATH_FMT_TEMPLATE[] =
        "data/BAP_Instances/last-10/CVRP-scaled-%d.0/%s";
    const char *FAMILIES[] = {"A", "B", "F", "E", "P"};
    const int32_t SFACTORS[] = {1, 2, 4, 5, 8, 10, 20};

    //
    // Compare the EFL, AFL dual bounds on families E, F and scales {1, 2, 4}
    // with DEFAULT_TIME_LIMIT
    //
    {
        for (int32_t fidx = 0; fidx < ARRAY_LEN_i32(FAMILIES); fidx++) {

            const char *family = FAMILIES[fidx];

            for (int32_t sidx = 0; sidx < ARRAY_LEN_i32(SFACTORS); sidx++) {
                const int32_t scale_factor = SFACTORS[sidx];

                if (scale_factor > 4) {
                    continue;
                }

                char batch_name[256];
                char dirpath[2048];

                snprintf_safe(
                    batch_name, ARRAY_LEN(batch_name),
                    "Fractional-labeling-comparison-for-%s-scaled-%d.0", family,
                    scale_factor);

                snprintf_safe(dirpath, ARRAY_LEN(dirpath), DIRPATH_FMT_TEMPLATE,
                              scale_factor, family);

                if (num_batches < MAX_NUM_BATCHES) {
                    batches[num_batches].max_num_procs = 14;
                    batches[num_batches].name = strdup(batch_name);
                    batches[num_batches].timelimit = 60;
                    batches[num_batches].nseeds = 1;
                    batches[num_batches].dirs[0] = strdup(dirpath);
                    batches[num_batches].dirs[1] = NULL;
                    batches[num_batches].filter = DEFAULT_FILTER;

                    int32_t num_solvers = 0;
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (EFL)",
                                         {"-DNUM_THREADS=1"}};
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (AFL)",
                                         {"-DAMORTIZED_FRACTIONAL_LABELING=1",
                                          "-DNUM_THREADS=1"}};
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (NFL)",
                                         {"-DDISABLE_FRACTIONAL_SEPARATION=1",
                                          "-DNUM_THREADS=1"}};
                }
                ++num_batches;
            }
        }
    }

    //
    // Compare the BAC MIP Pricer (AFL) against BapCod with DEFAULT_TIME_LIMIT
    //
    {
        for (int32_t fidx = 0; fidx < ARRAY_LEN_i32(FAMILIES); fidx++) {

            const char *family = FAMILIES[fidx];
            for (int32_t sidx = 0; sidx < ARRAY_LEN_i32(SFACTORS); sidx++) {

                const int32_t scale_factor = SFACTORS[sidx];
                if (scale_factor > 20) {
                    continue;
                }

                char batch_name[256];
                char dirpath[2048];

                snprintf_safe(batch_name, ARRAY_LEN(batch_name),
                              "%s-scaled-%d.0", family, scale_factor);

                snprintf_safe(dirpath, ARRAY_LEN(dirpath), DIRPATH_FMT_TEMPLATE,
                              scale_factor, family);

                if (num_batches < MAX_NUM_BATCHES) {
                    batches[num_batches].max_num_procs = 1;
                    batches[num_batches].name = strdup(batch_name);
                    batches[num_batches].timelimit = DEFAULT_TIME_LIMIT;
                    batches[num_batches].nseeds = 1;
                    batches[num_batches].dirs[0] = strdup(dirpath);
                    batches[num_batches].dirs[1] = NULL;
                    batches[num_batches].filter = DEFAULT_FILTER;

                    int32_t num_solvers = 0;
                    batches[num_batches].solvers[num_solvers++] =
                        (PerfProfSolver){"BAC MIP Pricer (AFL)",
                                         {"-DAMORTIZED_FRACTIONAL_LABELING=1"}};
                    batches[num_batches].solvers[num_solvers++] = BAPCOD_SOLVER;
                }
                ++num_batches;
            }
        }
    }

    return num_batches;
}